

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markethandler.h
# Opt level: O0

void __thiscall
hedg::Market_Handler::activate_market
          (Market_Handler *this,string *market_id,Market_Projection *market_projection)

{
  threadsafe_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>
  *this_00;
  mapped_type *this_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  local_a0;
  Market_Projection *local_20;
  Market_Projection *market_projection_local;
  string *market_id_local;
  Market_Handler *this_local;
  
  local_20 = market_projection;
  market_projection_local = (Market_Projection *)market_id;
  market_id_local = (string *)this;
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>_>_>
            ::operator[](&this->active,market_id);
  std::atomic<bool>::store(this_01,true,memory_order_seq_cst);
  this_00 = this->active_markets_;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_hedg::Market_Projection_&,_true>
            (&local_a0,market_id,market_projection);
  threadsafe_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>
  ::push(this_00,&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  ::~pair(&local_a0);
  return;
}

Assistant:

void activate_market(std::string market_id, Market_Projection market_projection) {
		active[market_id].store(true);
		active_markets_.push({ market_id, market_projection });
	}